

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dioextra.c
# Opt level: O3

bool auto_check_multi(DESCRIPTOR_DATA *d_check,char *host)

{
  DESCRIPTOR_DATA **ppDVar1;
  bool bVar2;
  DESCRIPTOR_DATA *pDVar3;
  
  pDVar3 = descriptor_list;
  if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
    do {
      if (((pDVar3 != d_check) && (pDVar3->character != (CHAR_DATA *)0x0)) &&
         (bVar2 = str_cmp(host,pDVar3->host), !bVar2)) {
        return true;
      }
      ppDVar1 = &pDVar3->next;
      pDVar3 = *ppDVar1;
    } while (*ppDVar1 != (DESCRIPTOR_DATA *)0x0);
  }
  return false;
}

Assistant:

bool auto_check_multi(DESCRIPTOR_DATA *d_check, char *host)
{
	for (DESCRIPTOR_DATA *d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d == d_check || d->character == nullptr)
			continue;

		if (!str_cmp(host, d->host))
			return true;
	}

	return false;
}